

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int rci_read_data(nifti_image *nim,int *pivots,int *prods,int nprods,int *dims,char *data,znzFile fp
                 ,size_t base_offset)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  char *__format;
  long lVar4;
  ulong uVar5;
  long lVar6;
  uint local_60;
  
  if (nprods < 1) {
    __format = "** rci_read_data, bad prods, %d\n";
    uVar5 = (ulong)(uint)nprods;
  }
  else {
    uVar5 = (ulong)(uint)*pivots;
    if (nprods != 1) {
      uVar3 = 1;
      lVar6 = 1;
      if (1 < *pivots) {
        lVar4 = 0;
        do {
          lVar6 = lVar6 * nim->dim[lVar4 + 1];
          lVar4 = lVar4 + 1;
        } while (uVar5 - 1 != lVar4);
      }
      uVar5 = 2;
      if (2 < nprods) {
        uVar5 = (ulong)(uint)nprods;
      }
      lVar4 = 1;
      do {
        lVar4 = lVar4 * prods[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
      if (0 < *prods) {
        uVar5 = lVar4 * nim->nbyper;
        local_60 = 0;
        lVar4 = 0;
        do {
          uVar3 = nim->nbyper * lVar6 * ((long)dims[*pivots] + nim->dim[*pivots] * lVar4);
          if (3 < g_opts_0) {
            fprintf(_stderr,"-d reading %u bytes, foff %u + %u, doff %u\n",uVar5 & 0xffffffff,
                    base_offset,uVar3 & 0xffffffff,(ulong)local_60);
          }
          iVar1 = rci_read_data(nim,pivots + 1,prods + 1,nprods + -1,dims,data,fp,
                                uVar3 + base_offset);
          if (iVar1 < 0) {
            return -1;
          }
          lVar4 = lVar4 + 1;
          data = data + uVar5;
          local_60 = local_60 + (int)uVar5;
        } while (lVar4 < *prods);
      }
      return 0;
    }
    if (uVar5 == 0) {
      znzseek(fp,base_offset,0);
      uVar5 = (long)nim->nbyper * (long)*prods;
      sVar2 = nifti_read_buffer(fp,data,uVar5,nim);
      if (sVar2 != uVar5) {
        fprintf(_stderr,"** rciRD: read only %u of %u bytes from \'%s\'\n",sVar2 & 0xffffffff,
                uVar5 & 0xffffffff,nim->fname);
        return -1;
      }
      if (3 < g_opts_0) {
        fprintf(_stderr,"+d successful read of %u bytes at offset %u\n",uVar5 & 0xffffffff,
                base_offset);
        return 0;
      }
      return 0;
    }
    __format = "** rciRD: final pivot == %d!\n";
  }
  fprintf(_stderr,__format,uVar5);
  return -1;
}

Assistant:

static int rci_read_data(nifti_image * nim, int * pivots, int * prods,
      int nprods, const int dims[], char * data, znzFile fp, size_t base_offset)
{
   size_t sublen, offset, read_size;
   int    c;

   /* bad check first - base_offset may not have been checked */
   if( nprods <= 0 ){
      fprintf(stderr,"** rci_read_data, bad prods, %d\n", nprods);
      return -1;
   }

   /* base case: actually read the data */
   if( nprods == 1 ){
      size_t nread, bytes;

      /* make sure things look good here */
      if( *pivots != 0 ){
         fprintf(stderr,"** rciRD: final pivot == %d!\n", *pivots);
         return -1;
      }

      /* so just seek and read (prods[0] * nbyper) bytes from the file */
      znzseek(fp, (long)base_offset, SEEK_SET);
      bytes = (size_t)prods[0] * nim->nbyper;
      nread = nifti_read_buffer(fp, data, bytes, nim);
      if( nread != bytes ){
         fprintf(stderr,"** rciRD: read only %u of %u bytes from '%s'\n",
                 (unsigned)nread, (unsigned)bytes, nim->fname);
         return -1;
      } else if( g_opts.debug > 3 )
         fprintf(stderr,"+d successful read of %u bytes at offset %u\n",
                 (unsigned)bytes, (unsigned)base_offset);

      return 0;  /* done with base case - return success */
   }

   /* not the base case, so do a set of reduced reads */

   /* compute size of sub-brick: all dimensions below pivot */
   for( c = 1, sublen = 1; c < *pivots; c++ ) sublen *= nim->dim[c];

   /* compute number of values to read, i.e. remaining prods */
   for( c = 1, read_size = 1; c < nprods; c++ ) read_size *= prods[c];
   read_size *= nim->nbyper;  /* and multiply by bytes per voxel */

   /* now repeatedly compute offsets, and recursively read */
   for( c = 0; c < prods[0]; c++ ){
      /* offset is (c * sub-block size (including pivot dim))   */
      /*         + (dims[] index into pivot sub-block)          */
      /* the unneeded multiplication is to make this more clear */
      offset = (size_t)c * sublen * nim->dim[*pivots] +
               (size_t)sublen * dims[*pivots];
      offset *= nim->nbyper;

      if( g_opts.debug > 3 )
         fprintf(stderr,"-d reading %u bytes, foff %u + %u, doff %u\n",
                 (unsigned)read_size, (unsigned)base_offset, (unsigned)offset,
                 (unsigned)(c*read_size));

      /* now read the next level down, adding this offset */
      if( rci_read_data(nim, pivots+1, prods+1, nprods-1, dims,
                    data + c * read_size, fp, base_offset + offset) < 0 )
         return -1;
   }

   return 0;
}